

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::TypeSpecializeInlineBuiltInUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,Value *src1OriginalVal,
          bool *redoTypeSpecRef)

{
  Opnd *opnd;
  code *pcVar1;
  int iVar2;
  bool bVar3;
  BuiltinFunction index;
  OpndKind OVar4;
  BuiltInFlags BVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  char *message;
  Value *pVVar8;
  OpCode OVar9;
  char *error;
  uint lineNumber;
  int iVar10;
  Instr *pIVar11;
  GlobOpt *this_00;
  int32 newMin;
  int32 newMax;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  Instr **local_48;
  Value *local_40;
  int32 local_38;
  int32 local_34;
  int maxVal;
  int minVal;
  
  local_40 = src1OriginalVal;
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1def,"(pSrc1Val)","pSrc1Val");
    if (!bVar3) goto LAB_00463e90;
    *puVar6 = 0;
  }
  bVar3 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1df2,"(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))",
                       "OpCodeAttr::IsInlineBuiltIn(instr->m_opcode)");
    if (!bVar3) goto LAB_00463e90;
    *puVar6 = 0;
  }
  index = Js::JavascriptLibrary::GetBuiltInInlineCandidateId((*pInstr)->m_opcode);
  if (index._value == 'H') {
    AssertCount = AssertCount + 1;
    local_48 = pInstr;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1df5,"(builtInId != Js::BuiltinFunction::None)",
                       "builtInId != Js::BuiltinFunction::None");
    if (!bVar3) goto LAB_00463e90;
    *puVar6 = 0;
    pInstr = local_48;
  }
  BVar5 = Js::JavascriptLibrary::GetFlagsForBuiltIn(index);
  if ((BVar5 & BIF_Args) == BIF_TypeSpecUnaryToFloat) {
    if ((this->field_0xf5 & 0x20) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e00,"(this->DoFloatTypeSpec())","this->DoFloatTypeSpec()");
      if (!bVar3) goto LAB_00463e90;
      *puVar6 = 0;
    }
    *pSrc1Val = local_40;
    bVar3 = TypeSpecializeFloatUnary(this,pInstr,local_40,pDstVal,true);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e05,"(retVal)",
                         "For inline built-ins the args have to be type-specialized to float, but something failed during the process."
                        );
      if (!bVar3) goto LAB_00463e90;
      *puVar6 = 0;
    }
    TypeSpecializeFloatDst(this,*pInstr,(Value *)0x0,*pSrc1Val,(Value *)0x0,pDstVal);
    return;
  }
  OVar9 = (*pInstr)->m_opcode;
  switch(OVar9) {
  case InlineMathAbs:
    bVar3 = ValueInfo::GetIntValMinMax((*pSrc1Val)->valueInfo,&local_34,&local_38,true);
    if (!bVar3) {
      if ((*(uint *)&this->field_0xf4 >> 0xd & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e2a,"(this->DoFloatTypeSpec())","this->DoFloatTypeSpec()");
        if (!bVar3) goto LAB_00463e90;
        *puVar6 = 0;
      }
      *pSrc1Val = local_40;
      bVar3 = TypeSpecializeFloatUnary(this,pInstr,local_40,pDstVal,true);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e2d,"(retVal)",
                           "For inline built-ins the args have to be type-specialized (float), but something failed during the process."
                          );
        if (!bVar3) goto LAB_00463e90;
        *puVar6 = 0;
      }
      pIVar11 = *pInstr;
      pVVar8 = *pSrc1Val;
LAB_00463e2a:
      TypeSpecializeFloatDst(this,pIVar11,(Value *)0x0,pVVar8,(Value *)0x0,pDstVal);
      return;
    }
    if ((*(uint *)&this->field_0xf4 >> 9 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e12,"(this->DoAggressiveIntTypeSpec())",
                         "this->DoAggressiveIntTypeSpec()");
      if (!bVar3) goto LAB_00463e90;
      *puVar6 = 0;
    }
    bVar3 = TypeSpecializeIntUnary
                      (this,pInstr,pSrc1Val,pDstVal,local_34,local_38,local_40,redoTypeSpecRef,true)
    ;
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e14,"(retVal)",
                         "For inline built-ins the args have to be type-specialized (int), but something failed during the process."
                        );
      if (!bVar3) goto LAB_00463e90;
      *puVar6 = 0;
    }
    iVar10 = -0x7fffffff;
    if (-0x7fffffff < local_34) {
      iVar10 = local_34;
    }
    iVar2 = -iVar10;
    if (0 < iVar10) {
      iVar2 = iVar10;
    }
    iVar10 = -0x7fffffff;
    if (-0x7fffffff < local_38) {
      iVar10 = local_38;
    }
    local_38 = -iVar10;
    if (0 < iVar10) {
      local_38 = iVar10;
    }
    if (local_38 < iVar2) {
      local_38 = iVar2;
    }
    if (local_34 < 1) {
      local_34 = 0;
    }
    pIVar11 = *pInstr;
    OVar9 = pIVar11->m_opcode;
    pVVar8 = *pSrc1Val;
    newMax = local_38;
    newMin = local_34;
LAB_00463bf8:
    TypeSpecializeIntDst
              (this,pIVar11,OVar9,(Value *)0x0,pVVar8,(Value *)0x0,BailOutInvalid,newMin,newMax,
               pDstVal,(AddSubConstantInfo *)0x0);
    return;
  case InlineMathClz:
    if ((this->field_0xf5 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e6d,"(this->DoAggressiveIntTypeSpec())",
                         "this->DoAggressiveIntTypeSpec()");
      if (!bVar3) goto LAB_00463e90;
      *puVar6 = 0;
    }
    if ((this->field_0xf5 & 0x10) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e6e,"(this->DoLossyIntTypeSpec())","this->DoLossyIntTypeSpec()");
      if (!bVar3) goto LAB_00463e90;
      *puVar6 = 0;
    }
    bVar3 = TypeSpecializeIntUnary
                      (this,pInstr,pSrc1Val,pDstVal,-0x80000000,0x7fffffff,local_40,redoTypeSpecRef,
                       false);
    if (bVar3) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(retVal)";
    message = "For clz32, the arg has to be type-specialized to int.";
    lineNumber = 0x1e71;
    break;
  case InlineMathCeil:
  case InlineMathFloor:
  case InlineMathRound:
    *pSrc1Val = local_40;
    bVar3 = TypeSpecializeFloatUnary(this,pInstr,local_40,pDstVal,true);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1e37,"(retVal)",
                         "For inline Math.floor and Math.ceil the src has to be type-specialized to float, but something failed during the process."
                        );
      if (!bVar3) goto LAB_00463e90;
      *puVar6 = 0;
    }
    TypeSpecializeIntDst
              (this,*pInstr,(*pInstr)->m_opcode,(Value *)0x0,*pSrc1Val,(Value *)0x0,BailOutInvalid,
               -0x80000000,0x7fffffff,pDstVal,(AddSubConstantInfo *)0x0);
    return;
  default:
    if (OVar9 == InlineArrayPop) {
      opnd = (*pInstr)->m_src1;
      if (opnd == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        local_48 = pInstr;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x1e49,"(thisOpnd)","thisOpnd");
        if (!bVar3) goto LAB_00463e90;
        *puVar6 = 0;
        pInstr = local_48;
      }
      ToVarUses(this,*pInstr,opnd,false,*pSrc1Val);
      if (this->prePassLoop == (Loop *)0x0) {
        local_4e = (opnd->m_valueType).field_0;
        bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_4e.field_0);
        if (bVar3) {
          GenerateBailAtOperation(this,pInstr,BailOutConventionalNativeArrayAccessOnly);
        }
      }
      if ((*pInstr)->m_dst == (Opnd *)0x0) {
        return;
      }
      local_4c = (opnd->m_valueType).field_0;
      bVar3 = ValueType::IsLikelyNativeIntArray((ValueType *)&local_4c.field_0);
      if (!bVar3) {
        local_4a = (opnd->m_valueType).field_0;
        bVar3 = ValueType::IsLikelyNativeFloatArray((ValueType *)&local_4a.field_0);
        pIVar11 = *pInstr;
        if (!bVar3) {
          OVar4 = IR::Opnd::GetKind(pIVar11->m_dst);
          if (OVar4 != OpndKindReg) {
            return;
          }
          this_00 = (GlobOpt *)(*pInstr)->m_dst;
          pRVar7 = IR::Opnd::AsRegOpnd((Opnd *)this_00);
          ToVarStackSym(this_00,pRVar7->m_sym,this->currentBlock);
          return;
        }
        pVVar8 = (Value *)0x0;
        goto LAB_00463e2a;
      }
      pIVar11 = *pInstr;
      OVar9 = pIVar11->m_opcode;
      pVVar8 = (Value *)0x0;
      newMax = 0x7fffffff;
      newMin = -0x80000000;
      goto LAB_00463bf8;
    }
  case Ctz:
  case Clz:
  case InlineMathMax:
  case InlineMathImul:
  case InlineMathMin:
  case InlineMathRandom:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    error = "(0)";
    message = "Unsupported built-in!";
    lineNumber = 0x1e75;
  }
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,lineNumber,error,message);
  if (bVar3) {
    *puVar6 = 0;
    return;
  }
LAB_00463e90:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
GlobOpt::TypeSpecializeInlineBuiltInUnary(IR::Instr **pInstr, Value **pSrc1Val, Value **pDstVal, Value *const src1OriginalVal, bool *redoTypeSpecRef)
{
    IR::Instr *&instr = *pInstr;

    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;

    Assert(OpCodeAttr::IsInlineBuiltIn(instr->m_opcode));

    Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInInlineCandidateId(instr->m_opcode);   // From actual instr, not profile based.
    Assert(builtInId != Js::BuiltinFunction::None);

    // Consider using different bailout for float/int FromVars, so that when the arg cannot be converted to number we don't disable
    //       type spec for other parts of the big function but rather just don't inline that built-in instr.
    //       E.g. could do that if the value is not likelyInt/likelyFloat.

    Js::BuiltInFlags builtInFlags = Js::JavascriptLibrary::GetFlagsForBuiltIn(builtInId);
    bool areAllArgsAlwaysFloat = (builtInFlags & Js::BuiltInFlags::BIF_Args) == Js::BuiltInFlags::BIF_TypeSpecUnaryToFloat;
    if (areAllArgsAlwaysFloat)
    {
        // InlineMathAcos, InlineMathAsin, InlineMathAtan, InlineMathCos, InlineMathExp, InlineMathLog, InlineMathSin, InlineMathSqrt, InlineMathTan.
        Assert(this->DoFloatTypeSpec());

        // Type-spec the src.
        src1Val = src1OriginalVal;
        bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, /* skipDst = */ true);
        AssertMsg(retVal, "For inline built-ins the args have to be type-specialized to float, but something failed during the process.");

        // Type-spec the dst.
        this->TypeSpecializeFloatDst(instr, nullptr, src1Val, nullptr, pDstVal);
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathAbs)
    {
        // Consider the case when the value is unknown - because of bailout in abs we may disable type spec for the whole function which is too much.
        // First, try int.
        int minVal, maxVal;
        bool shouldTypeSpecToInt = src1Val->GetValueInfo()->GetIntValMinMax(&minVal, &maxVal, /* doAggressiveIntTypeSpec = */ true);
        if (shouldTypeSpecToInt)
        {
            Assert(this->DoAggressiveIntTypeSpec());
            bool retVal = this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, minVal, maxVal, src1OriginalVal, redoTypeSpecRef, true);
            AssertMsg(retVal, "For inline built-ins the args have to be type-specialized (int), but something failed during the process.");

            if (!this->IsLoopPrePass())
            {
                // Create bailout for INT_MIN which does not have corresponding int value on the positive side.
                // Check int range: if we know the range is out of overflow, we do not need the bail out at all.
                if (minVal == INT32_MIN)
                {
                    GenerateBailAtOperation(&instr, IR::BailOnIntMin);
                }
            }

            // Account for ::abs(INT_MIN) == INT_MIN (which is less than 0).
            maxVal = ::max(
                ::abs(Int32Math::NearestInRangeTo(minVal, INT_MIN + 1, INT_MAX)),
                ::abs(Int32Math::NearestInRangeTo(maxVal, INT_MIN + 1, INT_MAX)));
            minVal = minVal >= 0 ? minVal : 0;
            this->TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, src1Val, nullptr, IR::BailOutInvalid, minVal, maxVal, pDstVal);
        }
        else
        {
            // If we couldn't do int, do float.
            Assert(this->DoFloatTypeSpec());
            src1Val = src1OriginalVal;
            bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, true);
            AssertMsg(retVal, "For inline built-ins the args have to be type-specialized (float), but something failed during the process.");

            this->TypeSpecializeFloatDst(instr, nullptr, src1Val, nullptr, pDstVal);
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathFloor || instr->m_opcode == Js::OpCode::InlineMathCeil || instr->m_opcode == Js::OpCode::InlineMathRound)
    {
        // Type specialize src to float
        src1Val = src1OriginalVal;
        bool retVal = this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal, /* skipDst = */ true);
        AssertMsg(retVal, "For inline Math.floor and Math.ceil the src has to be type-specialized to float, but something failed during the process.");

        // Type specialize dst to int
        this->TypeSpecializeIntDst(
            instr,
            instr->m_opcode,
            nullptr,
            src1Val,
            nullptr,
            IR::BailOutInvalid,
            INT32_MIN,
            INT32_MAX,
            pDstVal);
    }
    else if(instr->m_opcode == Js::OpCode::InlineArrayPop)
    {
        IR::Opnd *const thisOpnd = instr->GetSrc1();

        Assert(thisOpnd);

        // Ensure src1 (Array) is a var
        this->ToVarUses(instr, thisOpnd, false, src1Val);

        if(!this->IsLoopPrePass() && thisOpnd->GetValueType().IsLikelyNativeArray())
        {
            // We bail out, if there is illegal access or a mismatch in the Native array type that is optimized for, during the run time.
            GenerateBailAtOperation(&instr, IR::BailOutConventionalNativeArrayAccessOnly);
        }

        if(!instr->GetDst())
        {
            return;
        }

        // Try Type Specializing the element (return item from Pop) based on the array's profile data.
        if(thisOpnd->GetValueType().IsLikelyNativeIntArray())
        {
            this->TypeSpecializeIntDst(instr, instr->m_opcode, nullptr, nullptr, nullptr, IR::BailOutInvalid, INT32_MIN, INT32_MAX, pDstVal);
        }
        else if(thisOpnd->GetValueType().IsLikelyNativeFloatArray())
        {
            this->TypeSpecializeFloatDst(instr, nullptr, nullptr, nullptr, pDstVal);
        }
        else
        {
            // We reached here so the Element is not yet type specialized. Ensure element is a var
            if(instr->GetDst()->IsRegOpnd())
            {
                this->ToVarRegOpnd(instr->GetDst()->AsRegOpnd(), currentBlock);
            }
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineMathClz)
    {
        Assert(this->DoAggressiveIntTypeSpec());
        Assert(this->DoLossyIntTypeSpec());
        //Type specialize to int
        bool retVal = this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, INT32_MIN, INT32_MAX, src1OriginalVal, redoTypeSpecRef);
        AssertMsg(retVal, "For clz32, the arg has to be type-specialized to int.");
    }
    else
    {
        AssertMsg(FALSE, "Unsupported built-in!");
    }
}